

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

size_type __thiscall lf::mesh::hybrid2d::Mesh::NumEntities(Mesh *this,uint codim)

{
  size_type sVar1;
  size_type sVar2;
  runtime_error *this_00;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [380];
  uint local_1c;
  Mesh *pMStack_18;
  uint codim_local;
  Mesh *this_local;
  
  local_1c = codim;
  pMStack_18 = this;
  if (codim == 0) {
    sVar2 = std::vector<lf::mesh::hybrid2d::Triangle,_std::allocator<lf::mesh::hybrid2d::Triangle>_>
            ::size(&this->trias_);
    sVar1 = std::
            vector<lf::mesh::hybrid2d::Quadrilateral,_std::allocator<lf::mesh::hybrid2d::Quadrilateral>_>
            ::size(&this->quads_);
    this_local._4_4_ = (int)sVar2 + (int)sVar1;
  }
  else if (codim == 1) {
    sVar2 = std::vector<lf::mesh::hybrid2d::Segment,_std::allocator<lf::mesh::hybrid2d::Segment>_>::
            size(&this->segments_);
    this_local._4_4_ = (size_type)sVar2;
  }
  else {
    if (codim != 2) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::operator<<(local_198,"codim out of bounds.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"false",&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
                 ,&local_201);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_1d8,&local_200,0x3a,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar2 = std::vector<lf::mesh::hybrid2d::Point,_std::allocator<lf::mesh::hybrid2d::Point>_>::size
                      (&this->points_);
    this_local._4_4_ = (size_type)sVar2;
  }
  return this_local._4_4_;
}

Assistant:

Mesh::size_type Mesh::NumEntities(unsigned codim) const {
  switch (codim) {
    case 0:
      return trias_.size() + quads_.size();
    case 1:
      return segments_.size();
    case 2:
      return points_.size();
    default:
      LF_VERIFY_MSG(false, "codim out of bounds.");
  }
}